

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall cmCacheManager::CacheIterator::SetProperty(CacheIterator *this,string *p,bool v)

{
  _Base_ptr p_Var1;
  char *value;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    value = "OFF";
    if (v) {
      value = "ON";
    }
    CacheEntry::SetProperty((CacheEntry *)(p_Var1 + 2),p,value);
    return;
  }
  return;
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}